

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Makowski.hpp
# Opt level: O0

HRRDoubletStep * __thiscall
Makowski_HRR::DoubletStep_(Makowski_HRR *this,Doublet *target,RRStepType steptype)

{
  int iVar1;
  XYZStep XVar2;
  runtime_error *this_00;
  iterator pvVar3;
  iterator pvVar4;
  difference_type dVar5;
  RRStepType in_ECX;
  undefined4 *in_RDX;
  HRRDoubletStep *in_RDI;
  XYZStep xyzstep;
  Doublet src2d;
  Doublet src1d;
  Gaussian src1g;
  Gaussian common;
  int idx;
  reverse_iterator<const_int_*> it;
  int *v;
  ExpList ijk;
  Gaussian *t2;
  Gaussian *t;
  string tag;
  HRRDoubletStep *hrr;
  Doublet *in_stack_fffffffffffffcb8;
  Doublet *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  Gaussian *in_stack_fffffffffffffcd0;
  reverse_iterator<const_int_*> *in_stack_fffffffffffffcd8;
  reverse_iterator<const_int_*> *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  reverse_iterator<const_int_*> *in_stack_fffffffffffffcf0;
  reverse_iterator<const_int_*> *in_stack_fffffffffffffcf8;
  string local_250 [32];
  undefined4 local_230;
  _Type local_22c;
  _Type local_220;
  string local_210 [32];
  undefined4 local_1f0;
  _Type local_1ec;
  undefined8 local_1e0;
  undefined4 local_1d8;
  string local_1d0 [32];
  undefined4 local_1b0;
  _Type local_1ac;
  _Type local_1a0;
  string local_190 [160];
  ExpList local_f0;
  ExpList local_dc;
  ExpList local_d0;
  ExpList local_c0;
  reverse_iterator<const_int_*> local_b0 [2];
  int local_9c;
  reverse_iterator<const_int_*> local_88 [2];
  int *local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 *local_60;
  undefined8 *local_58;
  string local_40 [36];
  RRStepType local_1c;
  undefined4 *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_40,(string *)(in_RDX + 8));
  iVar1 = Doublet::am(in_stack_fffffffffffffcc0);
  if (iVar1 != 0) {
    if ((local_1c == I) || (local_1c == K)) {
      local_58 = (undefined8 *)(local_18 + 1);
      local_60 = local_18 + 4;
    }
    else {
      local_58 = (undefined8 *)(local_18 + 4);
      local_60 = local_18 + 1;
    }
    local_68 = *(undefined4 *)(local_58 + 1);
    local_70 = *local_58;
    std::array<int,_3UL>::begin((array<int,_3UL> *)0x10d455);
    std::array<int,_3UL>::end((array<int,_3UL> *)0x10d46a);
    std::sort<int*>((int *)in_stack_fffffffffffffcd0,
                    (int *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    pvVar3 = std::array<int,_3UL>::begin((array<int,_3UL> *)0x10d491);
    pvVar4 = std::array<int,_3UL>::end((array<int,_3UL> *)0x10d4a6);
    local_78 = std::
               find_if<int*,Makowski_HRR::DoubletStep_(Doublet_const&,RRStepType)::_lambda(int)_1_>
                         (pvVar3,pvVar4);
    std::array<int,_3UL>::rbegin
              ((array<int,_3UL> *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::array<int,_3UL>::rend
              ((array<int,_3UL> *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::find<std::reverse_iterator<int_const*>,int>
              (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
               (int *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::array<int,_3UL>::rbegin
              ((array<int,_3UL> *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::reverse_iterator<const_int_*>::reverse_iterator(local_b0,local_88);
    dVar5 = std::distance<std::reverse_iterator<int_const*>>
                      (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_9c = 2 - (int)dVar5;
    local_d0._M_elems =
         (_Type)Gaussian::StepDown(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,
                                   in_stack_fffffffffffffcc8);
    local_c0._M_elems = local_d0._M_elems;
    local_f0._M_elems =
         (_Type)Gaussian::StepUp(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,
                                 in_stack_fffffffffffffcc8);
    local_dc._M_elems = local_f0._M_elems;
    Doublet::Doublet((Doublet *)0x10d643);
    Doublet::Doublet((Doublet *)0x10d650);
    if ((local_1c == I) || (local_1c == K)) {
      local_1b0 = *local_18;
      local_1a0 = local_dc._M_elems;
      local_1ac = local_c0._M_elems;
      std::__cxx11::string::string(local_190,local_40);
      Doublet::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      Doublet::~Doublet((Doublet *)0x10d6f0);
      local_1f0 = *local_18;
      local_1d8 = local_18[6];
      local_1e0 = *(undefined8 *)(local_18 + 4);
      local_1ec = local_c0._M_elems;
      std::__cxx11::string::string(local_1d0,local_40);
      Doublet::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      Doublet::~Doublet((Doublet *)0x10d776);
    }
    else {
      local_230 = *local_18;
      local_22c = local_dc._M_elems;
      local_220 = local_c0._M_elems;
      std::__cxx11::string::string(local_210,local_40);
      Doublet::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      Doublet::~Doublet((Doublet *)0x10d81c);
      std::__cxx11::string::string(local_250,local_40);
      Doublet::operator=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      Doublet::~Doublet((Doublet *)0x10d8a2);
    }
    XVar2 = IdxToXYZStep(local_9c);
    in_RDI->type = local_1c;
    Doublet::Doublet(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    Doublet::Doublet(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    Doublet::Doublet(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    in_RDI->xyz = XVar2;
    Doublet::~Doublet((Doublet *)0x10d9e1);
    Doublet::~Doublet((Doublet *)0x10d9ee);
    std::__cxx11::string::~string(local_40);
    return in_RDI;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot HRR step to an s doublet!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual HRRDoubletStep DoubletStep_(const Doublet & target, RRStepType steptype)
        {
            const std::string tag = target.tag;

            if(target.am() == 0)
                throw std::runtime_error("Cannot HRR step to an s doublet!");

            const Gaussian * t;
            const Gaussian * t2;

            if(steptype == RRStepType::I || steptype == RRStepType::K)  // Going J->I or L->K
            {
                t = &target.left;
                t2 = &target.right;
            }
            else // Going I->J or K->L
            {
                t = &target.right;
                t2 = &target.left;
            }
                

            // idx is the xyz index
            ExpList ijk = t->ijk;
            std::sort(ijk.begin(), ijk.end());
            auto v = std::find_if(ijk.begin(), ijk.end(), [](int i) { return i != 0; });
            auto it = std::find(t->ijk.rbegin(), t->ijk.rend(), *v); 
            int idx = 2 - std::distance(t->ijk.rbegin(), it);  // remember we are working with reverse iterators

            // gaussian common to both src1 and src2
            Gaussian common(t->StepDown(idx, 1));

            // for src1
            Gaussian src1g(t2->StepUp(idx, 1));

            // create new doublets
            Doublet src1d, src2d;
            if(steptype == RRStepType::I || steptype == RRStepType::K)
            {
                src1d = Doublet{target.type, common, src1g, tag};
                src2d = Doublet{target.type, common, target.right, tag};
            }
            else
            {
                src1d = Doublet{target.type, src1g, common, tag};
                src2d = Doublet{target.type, target.left, common, tag};
            }
           
            XYZStep xyzstep = IdxToXYZStep(idx);

            // Create the HRR doublet step
            HRRDoubletStep hrr{steptype,
                               target, 
                               src1d, src2d,
                               xyzstep};
            return hrr;
        }